

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_puts(BIO *bp,char *buf)

{
  size_t sVar1;
  size_t len;
  char *in_local;
  BIO *bio_local;
  
  sVar1 = strlen(buf);
  if (sVar1 < 0x80000000) {
    bio_local._4_4_ = BIO_write(bp,buf,(int)sVar1);
  }
  else {
    ERR_put_error(0x11,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0x9b);
    bio_local._4_4_ = -1;
  }
  return bio_local._4_4_;
}

Assistant:

int BIO_puts(BIO *bio, const char *in) {
  size_t len = strlen(in);
  if (len > INT_MAX) {
    // |BIO_write| and the return value both assume the string fits in |int|.
    OPENSSL_PUT_ERROR(BIO, ERR_R_OVERFLOW);
    return -1;
  }
  return BIO_write(bio, in, (int)len);
}